

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[6],unsigned_long&,char_const(&)[3],unsigned_int,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [6],unsigned_long *params_1,
          char (*params_2) [3],uint *params_3,char (*params_4) [3])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff58;
  ArrayPtr<const_char> local_a0;
  ArrayPtr<const_char> local_90;
  ArrayPtr<const_char> local_80;
  CappedArray<char,_26UL> local_70;
  CappedArray<char,_14UL> local_48;
  
  local_80 = toCharSequence<char_const(&)[6]>((char (*) [6])this);
  toCharSequence<unsigned_long&>(&local_70,(kj *)params,(unsigned_long *)local_80.size_);
  local_90 = toCharSequence<char_const(&)[3]>((char (*) [3])params_1);
  toCharSequence<unsigned_int>(&local_48,(uint *)params_2);
  local_a0 = toCharSequence<char_const(&)[3]>((char (*) [3])params_3);
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_80,(ArrayPtr<const_char> *)&local_70,
             (CappedArray<char,_26UL> *)&local_90,(ArrayPtr<const_char> *)&local_48,
             (CappedArray<char,_14UL> *)&local_a0,in_stack_ffffffffffffff58);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}